

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,2ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          array<tinyusdz::value::half,_2UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_54;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_4e;
  bool bStack_48;
  undefined3 uStack_47;
  optional<std::array<tinyusdz::value::half,_2UL>_> pv_1;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_3e;
  optional<std::array<tinyusdz::value::half,_2UL>_> pv;
  array<tinyusdz::value::half,_2UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<tinyusdz::value::half,_2UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_007accf4;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
  if (bVar1) {
    get_default_value<std::array<tinyusdz::value::half,2ul>>
              ((optional<std::array<tinyusdz::value::half,_2UL>_> *)
               &((optional<std::array<tinyusdz::value::half,_2UL>_> *)
                ((long)register0x00000020 + -0x46))->contained,this);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
    optional<std::array<tinyusdz::value::half,_2UL>,_0>
              (&local_3e,
               (optional<std::array<tinyusdz::value::half,_2UL>_> *)
               &((optional<std::array<tinyusdz::value::half,_2UL>_> *)
                ((long)register0x00000020 + -0x46))->contained);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
              ((optional<std::array<tinyusdz::value::half,_2UL>_> *)
               &((optional<std::array<tinyusdz::value::half,_2UL>_> *)
                ((long)register0x00000020 + -0x46))->contained);
    bStack_48 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3e);
    if (bStack_48) {
      pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                         (&local_3e);
      *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar2->_M_elems;
      this_local._7_1_ = 1;
    }
    uStack_47 = 0;
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_3e);
    if (_bStack_48 != 0) goto LAB_007accf4;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_007accf4;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<tinyusdz::value::half,_2UL>,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<tinyusdz::value::half,2ul>>(&local_54,this);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
      optional<std::array<tinyusdz::value::half,_2UL>,_0>(&local_4e,&local_54);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_54)
      ;
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_4e);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                           (&local_4e);
        *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar2->_M_elems;
        this_local._7_1_ = 1;
      }
      uStack_47 = 0;
      bStack_48 = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_4e)
      ;
      if (_bStack_48 != 0) goto LAB_007accf4;
    }
    this_local._7_1_ = 0;
  }
LAB_007accf4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }